

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptSession.cpp
# Opt level: O2

Diagnostics * __thiscall
slang::ast::ScriptSession::getDiagnostics(Diagnostics *__return_storage_ptr__,ScriptSession *this)

{
  pointer psVar1;
  Diagnostics *container;
  SourceManager *sourceManager;
  shared_ptr<slang::syntax::SyntaxTree> *tree;
  pointer psVar2;
  
  (__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
  super_SmallVectorBase<slang::Diagnostic>.data_ =
       (pointer)(__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
                super_SmallVectorBase<slang::Diagnostic>.firstElement;
  (__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
  super_SmallVectorBase<slang::Diagnostic>.len = 0;
  (__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
  super_SmallVectorBase<slang::Diagnostic>.cap = 2;
  psVar1 = (this->syntaxTrees).
           super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar2 = (this->syntaxTrees).
                super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1) {
    SmallVectorBase<slang::Diagnostic>::append<slang::Diagnostics>
              ((SmallVectorBase<slang::Diagnostic> *)__return_storage_ptr__,
               &((psVar2->super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)
                ._M_ptr)->diagnosticsBuffer);
  }
  container = Compilation::getAllDiagnostics(&this->compilation);
  SmallVectorBase<slang::Diagnostic>::append<slang::Diagnostics>
            ((SmallVectorBase<slang::Diagnostic> *)__return_storage_ptr__,container);
  SmallVectorBase<slang::Diagnostic>::append<slang::Diagnostics>
            ((SmallVectorBase<slang::Diagnostic> *)__return_storage_ptr__,&(this->evalContext).diags
            );
  sourceManager = slang::syntax::SyntaxTree::getDefaultSourceManager();
  Diagnostics::sort(__return_storage_ptr__,sourceManager);
  return __return_storage_ptr__;
}

Assistant:

Diagnostics ScriptSession::getDiagnostics() {
    Diagnostics result;
    for (auto& tree : syntaxTrees)
        result.append(tree->diagnostics());

    result.append(compilation.getAllDiagnostics());
    result.append(evalContext.getDiagnostics());
    result.sort(SyntaxTree::getDefaultSourceManager());
    return result;
}